

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O3

bool __thiscall
Fossilize::ExternalReplayer::Impl::get_graphics_failed_validation
          (Impl *this,size_t *count,Hash *hashes)

{
  _Hash_node_base *p_Var1;
  
  if (hashes == (Hash *)0x0) {
    *count = (this->graphics_failed_validation)._M_h._M_element_count;
  }
  else {
    if (*count != (this->graphics_failed_validation)._M_h._M_element_count) {
      return false;
    }
    for (p_Var1 = (this->graphics_failed_validation)._M_h._M_before_begin._M_nxt;
        p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
      *hashes = (Hash)p_Var1[1]._M_nxt;
      hashes = hashes + 1;
    }
  }
  return true;
}

Assistant:

bool ExternalReplayer::Impl::get_failed(const std::unordered_set<Hash> &failed, size_t *count, Hash *hashes) const
{
	if (hashes)
	{
		if (*count != failed.size())
			return false;

		for (auto &mod : failed)
			*hashes++ = mod;
		return true;
	}
	else
	{
		*count = failed.size();
		return true;
	}
}